

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_deserialize_field
          (t_netstd_generator *this,ostream *out,t_field *tfield,string *prefix,bool is_propertyless
          )

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar6 [12];
  allocator local_b1;
  string local_b0;
  string name;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)resolve_typedef(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar4,&name,&tfield->name_);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (is_propertyless) {
    std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
  }
  else {
    prop_name_abi_cxx11_(&local_b0,this,tfield,false);
  }
  std::operator+(&name,prefix,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar2 != '\0') ||
         (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         (char)iVar2 != '\0')) {
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_b0);
        poVar3 = std::operator<<(poVar3,(string *)&name);
        std::operator<<(poVar3," = ");
        std::__cxx11::string::~string((string *)&local_b0);
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
        if ((char)iVar2 != '\0') {
          poVar3 = std::operator<<(out,"(");
          type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,true);
          poVar3 = std::operator<<(poVar3,(string *)&local_b0);
          std::operator<<(poVar3,")");
          std::__cxx11::string::~string((string *)&local_b0);
        }
        std::operator<<(out,"await iprot.");
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar2 == '\0') {
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar2 != '\0') {
            poVar3 = std::operator<<(out,"ReadI32Async(");
            poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
            std::operator<<(poVar3,");");
          }
        }
        else {
          this_01 = (t_base_type *)
                    (ulong)*(uint *)&(tstruct->members_).
                                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
          switch(this_01) {
          case (t_base_type *)0x0:
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",&name)
            ;
            __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
            pcVar5 = "ReadStringAsync(";
            if ((char)iVar2 != '\0') {
              pcVar5 = "ReadBinaryAsync(";
            }
            break;
          case (t_base_type *)0x2:
            pcVar5 = "ReadBoolAsync(";
            break;
          case (t_base_type *)0x3:
            pcVar5 = "ReadByteAsync(";
            break;
          case (t_base_type *)0x4:
            pcVar5 = "ReadI16Async(";
            break;
          case (t_base_type *)0x5:
            pcVar5 = "ReadI32Async(";
            break;
          case (t_base_type *)0x6:
            pcVar5 = "ReadI64Async(";
            break;
          case (t_base_type *)0x7:
            pcVar5 = "ReadDoubleAsync(";
            break;
          default:
            auVar6 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_b0,this_01,auVar6._8_4_);
            std::operator+(auVar6._0_8_,"compiler error: no C# name for base type ",&local_b0);
            __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar3 = std::operator<<(out,pcVar5);
          poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
          std::operator<<(poVar3,");");
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        goto LAB_0024cfb7;
      }
      pcVar1 = (tfield->name_)._M_dataplus._M_p;
      type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,true);
      this_00 = &local_b0;
      printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
             local_b0._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&name);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_70);
      this_00 = &local_70;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)&name);
    generate_deserialize_struct(this,out,tstruct,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0024cfb7:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix, bool is_propertyless)
{
    t_type* type = tfield->get_type();
    type = resolve_typedef( type);

    if (type->is_void())
    {
        throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
    }

    string name = prefix + (is_propertyless ? "" : prop_name(tfield));

    if (type->is_struct() || type->is_xception())
    {
        generate_deserialize_struct(out, static_cast<t_struct*>(type), name);
    }
    else if (type->is_container())
    {
        generate_deserialize_container(out, type, name);
    }
    else if (type->is_base_type() || type->is_enum())
    {
        out << indent() << name << " = ";

        if (type->is_enum())
        {
            out << "(" << type_name(type) << ")";
        }

        out << "await iprot.";

        if (type->is_base_type())
        {
            t_base_type::t_base tbase = static_cast<t_base_type*>(type)->get_base();
            switch (tbase)
            {
            case t_base_type::TYPE_VOID:
                throw "compiler error: cannot serialize void field in a struct: " + name;
                break;
            case t_base_type::TYPE_STRING:
                if (type->is_binary())
                {
                    out << "ReadBinaryAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                else
                {
                    out << "ReadStringAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                break;
            case t_base_type::TYPE_BOOL:
                out << "ReadBoolAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I8:
                out << "ReadByteAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I16:
                out << "ReadI16Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I32:
                out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I64:
                out << "ReadI64Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_DOUBLE:
                out << "ReadDoubleAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            default:
                throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase);
            }
        }
        else if (type->is_enum())
        {
            out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
        }
        out << endl;
    }
    else
    {
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n", tfield->get_name().c_str(), type_name(type).c_str());
    }
}